

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderIntegerFunctionTests.cpp
# Opt level: O3

bool __thiscall
vkt::shaderexecutor::findMSBCaseInstance::compare
          (findMSBCaseInstance *this,void **inputs,void **outputs)

{
  DataType dataType;
  uint uVar1;
  int iVar2;
  pointer pSVar3;
  uint uVar4;
  ostream *poVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  ostringstream *this_00;
  ulong uVar12;
  bool bVar13;
  
  pSVar3 = (this->super_IntegerFunctionTestInstance).m_spec.inputs.
           super__Vector_base<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>
           ._M_impl.super__Vector_impl_data._M_start;
  dataType = (pSVar3->varType).m_data.basic.type;
  uVar1 = *(uint *)((long)&(pSVar3->varType).m_data + 4);
  uVar4 = glu::getDataTypeScalarSize(dataType);
  if (0 < (int)uVar4) {
    uVar12 = 0;
    bVar13 = false;
    do {
      uVar6 = *(uint *)((long)*inputs + uVar12 * 4);
      uVar9 = uVar6 & (2 << ((&DAT_00b2ceb8)[(ulong)uVar1 * 4] - 1 & 0x1f)) - 1U;
      if (dataType - TYPE_INT < 4) {
        uVar9 = (uVar9 & 1 << ((&DAT_00b2ceb8)[(ulong)uVar1 * 4] - 1 & 0x1f)) * -2 | uVar9;
        if ((int)uVar9 < 1) {
          iVar10 = -1;
          if ((int)uVar9 < 0) {
            uVar9 = uVar9 ^ 0xffffffff;
            if (uVar9 == 0) {
              uVar8 = 0x20;
            }
            else {
              uVar8 = 0x1f;
              if (uVar9 != 0) {
                for (; uVar9 >> uVar8 == 0; uVar8 = uVar8 - 1) {
                }
              }
              uVar8 = uVar8 ^ 0x1f;
            }
            iVar10 = 0x1f - uVar8;
          }
        }
        else {
          iVar10 = 0x1f;
          if (uVar9 != 0) {
            for (; uVar9 >> iVar10 == 0; iVar10 = iVar10 + -1) {
            }
          }
        }
        if ((int)uVar6 < 1) {
          iVar11 = -1;
          if ((int)uVar6 < 0) {
            uVar6 = uVar6 ^ 0xffffffff;
            if (uVar6 == 0) {
              uVar9 = 0x20;
            }
            else {
              uVar9 = 0x1f;
              if (uVar6 != 0) {
                for (; uVar6 >> uVar9 == 0; uVar9 = uVar9 - 1) {
                }
              }
              uVar9 = uVar9 ^ 0x1f;
            }
            iVar11 = 0x1f - uVar9;
          }
        }
        else {
          iVar11 = 0x1f;
          if (uVar6 != 0) {
            for (; uVar6 >> iVar11 == 0; iVar11 = iVar11 + -1) {
            }
          }
        }
      }
      else {
        uVar7 = 0x20;
        uVar8 = 0x20;
        if (uVar9 != 0) {
          uVar8 = 0x1f;
          if (uVar9 != 0) {
            for (; uVar9 >> uVar8 == 0; uVar8 = uVar8 - 1) {
            }
          }
          uVar8 = uVar8 ^ 0x1f;
        }
        if (uVar6 != 0) {
          uVar7 = 0x1f;
          if (uVar6 != 0) {
            for (; uVar6 >> uVar7 == 0; uVar7 = uVar7 - 1) {
            }
          }
          uVar7 = uVar7 ^ 0x1f;
        }
        iVar10 = 0x1f - uVar8;
        iVar11 = 0x1f - uVar7;
      }
      iVar2 = *(int *)((long)*outputs + uVar12 * 4);
      if ((iVar2 < iVar10) || (iVar11 < iVar2)) {
        this_00 = &(this->super_IntegerFunctionTestInstance).m_failMsg;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Expected [",10);
        poVar5 = (ostream *)std::ostream::operator<<(this_00,(int)uVar12);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"] in range [",0xc);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,", ",2);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,iVar11);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"]",1);
        return bVar13;
      }
      uVar12 = uVar12 + 1;
      bVar13 = uVar4 <= uVar12;
    } while (uVar12 != uVar4);
  }
  return true;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const bool				isSigned		= glu::isDataTypeIntOrIVec(type);
		const int				scalarSize		= glu::getDataTypeScalarSize(type);
		const int				integerLength	= getShaderUintBitCount(m_shaderType, precision);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const deUint32	value	= ((const deUint32*)inputs[0])[compNdx];
			const int		out		= ((const deInt32*)outputs[0])[compNdx];
			const int		minRef	= isSigned ? findMSB(toPrecision(deInt32(value), integerLength))	: findMSB(toPrecision(value, integerLength));
			const int		maxRef	= isSigned ? findMSB(deInt32(value))								: findMSB(value);

			if (!de::inRange(out, minRef, maxRef))
			{
				m_failMsg << "Expected [" << compNdx << "] in range [" << minRef << ", " << maxRef << "]";
				return false;
			}
		}

		return true;
	}